

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

void __thiscall QTreeWidget::collapseItem(QTreeWidget *this,QTreeWidgetItem *item)

{
  QTreeWidgetPrivate *this_00;
  QTreeModel *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeWidgetPrivate **)
             &(this->super_QTreeView).super_QAbstractItemView.super_QAbstractScrollArea.super_QFrame
              .super_QWidget.field_0x8;
  pQVar1 = QTreeWidgetPrivate::treeModel(this_00);
  if (pQVar1 == (QTreeModel *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = pQVar1->skipPendingSort;
    pQVar1->skipPendingSort = true;
  }
  QTreeWidgetPrivate::index
            ((QTreeWidgetPrivate *)&stack0xffffffffffffffb0,(char *)this_00,(int)item);
  QTreeView::collapse(&this->super_QTreeView,(QModelIndex *)&stack0xffffffffffffffb0);
  if (pQVar1 != (QTreeModel *)0x0) {
    pQVar1->skipPendingSort = bVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidget::collapseItem(const QTreeWidgetItem *item)
{
    Q_D(QTreeWidget);
    QTreeModel::SkipSorting skipSorting(d->treeModel());
    collapse(d->index(item));
}